

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

boolean revive_corpse(obj *corpse)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  boolean bVar5;
  char *pcVar6;
  char *pcVar7;
  monst *worm;
  monst *mtmp;
  char *line;
  obj *obj;
  int container_where;
  obj *local_240;
  char sackname [256];
  char cname_buf [256];
  
  container_where = 0;
  cVar1 = corpse->where;
  local_240 = uwep;
  builtin_strncpy(cname_buf,"bite-covered ",0xe);
  pcVar6 = eos(cname_buf);
  pcVar7 = corpse_xname(corpse,'\x01');
  strcpy(pcVar6,pcVar7);
  if (cVar1 == '\x02') {
    obj = (corpse->v).v_nexthere;
    worm = get_container_location(obj,&container_where,(int *)0x0);
    if (container_where != 4) {
      worm = (monst *)0x0;
    }
  }
  else {
    if (cVar1 == '\x04') {
      worm = (corpse->v).v_ocarry;
    }
    else {
      worm = (monst *)0x0;
    }
    obj = (obj *)0x0;
  }
  mtmp = revive(corpse);
  if (mtmp == (monst *)0x0) {
    return '\0';
  }
  iVar2 = mtmp->mhp;
  iVar3 = mtmp->mhpmax;
  if (iVar2 < iVar3) {
    pcVar6 = cname_buf;
  }
  switch(cVar1) {
  case '\x01':
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      return '\x01';
    }
    if (iVar2 < iVar3) {
      pcVar6 = Adjmonnam(mtmp,"bite-covered");
    }
    else {
      pcVar6 = Monnam(mtmp);
    }
    pcVar7 = "%s rises from the dead!";
    goto LAB_0016ede3;
  case '\x02':
    if (((container_where == 4) && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) &&
       (worm != (monst *)0x0)) {
      if (worm->wormno == '\0') {
        if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0016ee56;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016ece4;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016ecdb;
        }
        else {
LAB_0016ecdb:
          if (ublindf == (obj *)0x0) goto LAB_0016ef0b;
LAB_0016ece4:
          if (ublindf->oartifact != '\x1d') goto LAB_0016ef0b;
        }
        if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
            (((youmonst.data)->mflags3 & 0x100) == 0)) ||
           (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))
        goto LAB_0016ef0b;
      }
      else {
        bVar5 = worm_known(level,worm);
        if (bVar5 == '\0') goto LAB_0016ef0b;
      }
LAB_0016ee56:
      uVar4 = *(uint *)&worm->field_0x60;
      if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar4 & 0x280) == 0) goto LAB_0016eea1;
      }
      else if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0016eea1:
        if ((obj != (obj *)0x0) && ((u._1052_1_ & 0x20) == 0)) {
          pcVar6 = mon_nam(worm);
          pcVar6 = s_suffix(pcVar6);
          pcVar7 = xname(obj);
          sprintf(sackname,"%s %s",pcVar6,pcVar7);
          pcVar6 = Amonnam(mtmp);
          pline("%s writhes out of %s!",pcVar6,sackname);
          return '\x01';
        }
      }
    }
LAB_0016ef0b:
    if (obj == (obj *)0x0 || container_where != 3) {
      if (container_where != 1 || obj == (obj *)0x0) {
        return '\x01';
      }
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
        return '\x01';
      }
      pcVar6 = xname(obj);
      pcVar7 = an(pcVar6);
      pcVar6 = sackname;
      strcpy(pcVar6,pcVar7);
      pcVar7 = Amonnam(mtmp);
      line = "%s escapes from %s!";
      goto LAB_0016efec;
    }
    pcVar6 = xname(obj);
    pcVar6 = an(pcVar6);
    strcpy(sackname,pcVar6);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016ef65;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016ef60;
LAB_0016f01b:
      pcVar6 = Amonnam(mtmp);
    }
    else {
LAB_0016ef60:
      if (ublindf != (obj *)0x0) {
LAB_0016ef65:
        if (ublindf->oartifact == '\x1d') goto LAB_0016f01b;
      }
      pcVar6 = "Something";
    }
    pcVar7 = locomotion(mtmp->data,"writhes");
    pline("%s %s out of %s in your pack!",pcVar6,pcVar7,sackname);
    break;
  case '\x03':
    if (local_240 == corpse) {
      pline("The %s writhes out of your grasp!",pcVar6);
    }
    else {
      pline("You feel squirming in your backpack!");
    }
    break;
  case '\x04':
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      return '\x01';
    }
    if (worm->wormno == '\0') {
      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0016ed4f;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0016ec98;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0016ec8f;
      }
      else {
LAB_0016ec8f:
        if (ublindf == (obj *)0x0) goto LAB_0016edc4;
LAB_0016ec98:
        if (ublindf->oartifact != '\x1d') goto LAB_0016edc4;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[worm->my][worm->mx] & 1U) != 0)
          ) && ((worm->data->mflags3 & 0x200) != 0)) goto LAB_0016ed4f;
    }
    else {
      bVar5 = worm_known(level,worm);
      if (bVar5 != '\0') {
LAB_0016ed4f:
        uVar4 = *(uint *)&worm->field_0x60;
        if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar4 & 0x280) == 0) goto LAB_0016ed96;
        }
        else if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0016ed96:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar7 = mon_nam(worm);
            pcVar6 = an(pcVar6);
            line = "Startled, %s drops %s as it revives!";
LAB_0016efec:
            pline(line,pcVar7,pcVar6);
            return '\x01';
          }
        }
      }
    }
LAB_0016edc4:
    if (iVar2 < iVar3) {
      pcVar6 = Adjmonnam(mtmp,"bite-covered");
    }
    else {
      pcVar6 = Monnam(mtmp);
    }
    pcVar7 = "%s suddenly appears!";
LAB_0016ede3:
    pline(pcVar7,pcVar6);
    return '\x01';
  default:
    impossible("revive_corpse: lost corpse @ %d",(ulong)(uint)(int)cVar1);
  }
  return '\x01';
}

Assistant:

boolean revive_corpse(struct obj *corpse)
{
    struct monst *mtmp, *mcarry;
    boolean is_uwep, chewed;
    xchar where;
    char *cname, cname_buf[BUFSZ];
    struct obj *container = NULL;
    int container_where = 0;
    
    where = corpse->where;
    is_uwep = corpse == uwep;
    cname = eos(strcpy(cname_buf, "bite-covered "));
    strcpy(cname, corpse_xname(corpse, TRUE));
    mcarry = (where == OBJ_MINVENT) ? corpse->ocarry : 0;

    if (where == OBJ_CONTAINED) {
    	struct monst *mtmp2 = NULL;
	container = corpse->ocontainer;
    	mtmp2 = get_container_location(container, &container_where, NULL);
	/* container_where is the outermost container's location even if nested */
	if (container_where == OBJ_MINVENT && mtmp2) mcarry = mtmp2;
    }
    mtmp = revive(corpse);	/* corpse is gone if successful */

    if (mtmp) {
	chewed = (mtmp->mhp < mtmp->mhpmax);
	if (chewed) cname = cname_buf;	/* include "bite-covered" prefix */
	switch (where) {
	    case OBJ_INVENT:
		if (is_uwep)
		    pline("The %s writhes out of your grasp!", cname);
		else
		    pline("You feel squirming in your backpack!");
		break;

	    case OBJ_FLOOR:
		if (cansee(mtmp->mx, mtmp->my))
		    pline("%s rises from the dead!", chewed ?
			  Adjmonnam(mtmp, "bite-covered") : Monnam(mtmp));
		break;

	    case OBJ_MINVENT:		/* probably a nymph's */
		if (cansee(mtmp->mx, mtmp->my)) {
		    if (canseemon(level, mcarry))
			pline("Startled, %s drops %s as it revives!",
			      mon_nam(mcarry), an(cname));
		    else
			pline("%s suddenly appears!", chewed ?
			      Adjmonnam(mtmp, "bite-covered") : Monnam(mtmp));
		}
		break;
	   case OBJ_CONTAINED:
		if (container_where == OBJ_MINVENT && cansee(mtmp->mx, mtmp->my) &&
		    mcarry && canseemon(level, mcarry) && container) {
		        char sackname[BUFSZ];
		        sprintf(sackname, "%s %s", s_suffix(mon_nam(mcarry)),
				xname(container)); 
			pline("%s writhes out of %s!", Amonnam(mtmp), sackname);
		} else if (container_where == OBJ_INVENT && container) {
		        char sackname[BUFSZ];
		        strcpy(sackname, an(xname(container)));
			pline("%s %s out of %s in your pack!",
				Blind ? "Something" : Amonnam(mtmp),
				locomotion(mtmp->data,"writhes"),
				sackname);
		} else if (container_where == OBJ_FLOOR && container &&
		            cansee(mtmp->mx, mtmp->my)) {
		        char sackname[BUFSZ];
		        strcpy(sackname, an(xname(container)));
			pline("%s escapes from %s!", Amonnam(mtmp), sackname);
		}
		break;
	    default:
		/* we should be able to handle the other cases... */
		impossible("revive_corpse: lost corpse @ %d", where);
		break;
	}
	return TRUE;
    }
    return FALSE;
}